

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O1

ssize_t __thiscall
TCPConnection::recv(TCPConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  mutex *pmVar1;
  State SVar2;
  uint16_t base_1;
  ushort uVar3;
  uint uVar4;
  ssize_t sVar5;
  ulong uVar6;
  _Elt_pointer extraout_RAX;
  _Elt_pointer extraout_RAX_00;
  _Elt_pointer ppVar7;
  _Elt_pointer extraout_RAX_01;
  ulong uVar8;
  ushort uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  uchar *__last;
  undefined4 in_register_00000034;
  int __flags_00;
  uint uVar13;
  bool bVar15;
  unique_lock<std::mutex> lck1;
  unique_lock<std::mutex> lck0;
  const_iterator local_50;
  void *pvVar14;
  
  uVar8 = (ulong)(uint)__flags;
  lVar10 = CONCAT44(in_register_00000034,__fd);
  uVar3 = *(ushort *)(lVar10 + 0xc);
  uVar13 = uVar3 >> 2 & 0x3c;
  pvVar14 = (void *)(ulong)uVar13;
  if (__buf < pvVar14) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"malformed TCP segment. Size too small.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
    std::ostream::put(-0x68);
    sVar5 = std::ostream::flush();
    return sVar5;
  }
  uVar6 = __n & 0xffffffff;
  SVar2 = this->state_;
  if (SVar2 == SYN_SENT) {
    if ((uVar3 >> 10 & 1) == 0) {
      if ((uVar3 >> 9 & 1) == 0) {
        return uVar6;
      }
      uVar13 = *(uint *)(lVar10 + 4);
      uVar13 = (uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18)
               + 1;
      this->ack_number_ =
           uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 * 0x1000000;
      sVar5 = send(this,0,(void *)0x0,0x1050,__flags);
      this->state_ = ESTABLISHED;
      this->poll_flags_ = this->poll_flags_ | 0x304;
      if ((this->established_cb_).super__Function_base._M_manager == (_Manager_type)0x0) {
        return sVar5;
      }
      lck0._M_device = (mutex_type *)((ulong)lck0._M_device & 0xffffffff00000000);
      sVar5 = (*(this->established_cb_)._M_invoker)
                        ((_Any_data *)&this->established_cb_,(int *)&lck0);
      return sVar5;
    }
    if ((uVar3 >> 0xc & 1) == 0) {
      return uVar6;
    }
  }
  else {
    if (SVar2 == CLOSED) {
      uVar9 = 0x450;
      if ((uVar3 >> 0xc & 1) == 0) {
        lck0._M_device = (mutex_type *)CONCAT44(lck0._M_device._4_4_,0x10000400);
        uVar9 = 0x50;
        lVar11 = 0;
        do {
          uVar9 = uVar9 | *(ushort *)((long)&lck0._M_device + lVar11);
          lVar11 = lVar11 + 2;
        } while (lVar11 != 4);
      }
      sVar5 = send(this,0,(void *)0x0,(ulong)uVar9,
                   (uint)(ushort)(*(ushort *)(lVar10 + 2) << 8 | *(ushort *)(lVar10 + 2) >> 8));
      return sVar5;
    }
    if (((uVar3 >> 10 & 1) == 0) ||
       ((uVar6 = (ulong)(SVar2 - ESTABLISHED), 3 < SVar2 - ESTABLISHED &&
        (uVar6 = (ulong)(SVar2 - CLOSING), 2 < SVar2 - CLOSING)))) {
      bVar15 = (uVar3 >> 9 & 1) == 0;
      if (7 < SVar2 - SYN_RECEIVED || bVar15) {
        if ((uVar3 >> 0xc & 1) == 0) {
          return CONCAT71((int7)(uVar6 >> 8),bVar15);
        }
        uVar4 = *(uint *)(lVar10 + 8);
        uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        pmVar1 = &this->_read_m;
        do {
          __flags_00 = (int)uVar8;
          ppVar7 = (this->send_buf_).
                   super__Deque_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (ppVar7 == (this->send_buf_).
                        super__Deque_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
          lck0._M_owns = false;
          lck0._M_device = pmVar1;
          std::unique_lock<std::mutex>::lock(&lck0);
          lck0._M_owns = true;
          ppVar7 = (this->send_buf_).
                   super__Deque_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          std::unique_lock<std::mutex>::unlock(&lck0);
          __flags_00 = (int)uVar8;
          uVar12 = *(uint *)(ppVar7->first + 4);
          uVar12 = (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                   uVar12 << 0x18) + (int)ppVar7->second;
          if (uVar4 < uVar12) {
            std::unique_lock<std::mutex>::~unique_lock(&lck0);
            ppVar7 = extraout_RAX_00;
            break;
          }
          if ((ppVar7->first[0xd] & 1) != 0) {
            if (this->state_ == LAST_ACK) {
              this->state_ = CLOSED;
              if ((this->close_cb_).super__Function_base._M_manager != (_Manager_type)0x0) {
                lck1._M_device = (mutex_type *)((ulong)lck1._M_device & 0xffffffff00000000);
                (*(this->close_cb_)._M_invoker)((_Any_data *)&this->close_cb_,(int *)&lck1);
              }
            }
            else if (this->state_ == FIN_WAIT_1) {
              this->state_ = FIN_WAIT_2;
            }
          }
          if (ppVar7->first != (uchar *)0x0) {
            operator_delete__(ppVar7->first);
          }
          lck1._M_owns = false;
          lck1._M_device = pmVar1;
          std::unique_lock<std::mutex>::lock(&lck1);
          lck1._M_owns = true;
          std::
          deque<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
          ::pop_front(&this->send_buf_);
          std::unique_lock<std::mutex>::unlock(&lck1);
          std::unique_lock<std::mutex>::~unique_lock(&lck1);
          std::unique_lock<std::mutex>::~unique_lock(&lck0);
          __flags_00 = (int)uVar8;
          ppVar7 = extraout_RAX;
        } while (uVar12 <= uVar4);
        if (__buf != pvVar14) {
          lck1._M_owns = false;
          lck1._M_device = pmVar1;
          std::unique_lock<std::mutex>::lock(&lck1);
          lck1._M_owns = true;
          local_50._M_cur =
               (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
          local_50._M_first =
               (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_first;
          local_50._M_last =
               (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_last;
          local_50._M_node =
               (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node;
          __last = (uchar *)((long)__buf + lVar10);
          std::deque<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
                    ((iterator *)&lck0,
                     (deque<unsigned_char,std::allocator<unsigned_char>> *)&this->_recv_buf,
                     &local_50,(uchar *)((long)pvVar14 + lVar10),__last);
          __flags_00 = (int)__last;
          *(byte *)&this->poll_flags_ = (byte)this->poll_flags_ | 0xc3;
          std::unique_lock<std::mutex>::unlock(&lck1);
          uVar4 = this->ack_number_;
          uVar13 = (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18)
                   + ((int)__buf - uVar13);
          this->ack_number_ =
               uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
               uVar13 * 0x1000000;
          send(this,0,(void *)0x0,0x1050,__flags_00);
          std::unique_lock<std::mutex>::~unique_lock(&lck1);
          ppVar7 = extraout_RAX_01;
        }
        if ((uVar3 >> 8 & 1) == 0) {
          return (ssize_t)ppVar7;
        }
        uVar13 = this->ack_number_;
        uVar13 = (uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                 uVar13 << 0x18) + 1;
        this->ack_number_ =
             uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 * 0x1000000
        ;
        send(this,0,(void *)0x0,0x1050,__flags_00);
        if (this->state_ - FIN_WAIT_1 < 2) {
          this->state_ = TIME_WAIT;
          lck1._M_device = (mutex_type *)this;
          std::thread::
          thread<TCPConnection::recv(unsigned_char_const*,unsigned_long,unsigned_int)::__0,,void>
                    ((thread *)&lck0,(anon_class_8_1_8991fb9c_for__M_head_impl *)&lck1);
          uVar8 = std::thread::detach();
          if (lck0._M_device != (mutex_type *)0x0) {
            std::terminate();
          }
        }
        else {
          uVar13 = this->state_ - SYN_RECEIVED;
          uVar8 = (ulong)uVar13;
          if (uVar13 < 2) {
            this->state_ = CLOSE_WAIT;
          }
        }
        *(byte *)&this->poll_flags_ = (byte)this->poll_flags_ | 0xc3;
        return uVar8;
      }
      uVar13 = this->ack_number_;
      uVar13 = (uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18)
               + 1;
      this->ack_number_ =
           uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 * 0x1000000;
      lck0._M_device = (mutex_type *)CONCAT44(lck0._M_device._4_4_,0x10000400);
      uVar3 = 0x50;
      lVar10 = 0;
      do {
        uVar3 = uVar3 | *(ushort *)((long)&lck0._M_device + lVar10);
        lVar10 = lVar10 + 2;
      } while (lVar10 != 4);
      uVar6 = send(this,0,(void *)0x0,(ulong)uVar3,__flags);
    }
  }
  this->state_ = CLOSED;
  return uVar6;
}

Assistant:

void TCPConnection::recv(uint8_t const *data, size_t len, uint32_t from_ip) noexcept {
    auto *tcp = reinterpret_cast<tcp_t const *>(data);
    uint16_t flags = tcp->flags;
    uint16_t header_len = ((flags & 0x00f0) >> 4) * 4;
    if (header_len > len) {
        std::cerr << "malformed TCP segment. Size too small." << std::endl;
        return;
    }

    size_t payload_size = len - header_len;

    // step 1 If the state is CLOSED
    if (state_ == State::CLOSED) {
        send(nullptr, 0,
             has_ack(flags) ? get_flags({RST_MASK}) : get_flags({RST_MASK, ACK_MASK}),
             ntohs(tcp->dst_port),
             ntohs(tcp->src_port),
             has_ack(flags) ? tcp->ack : 0,
             has_ack(flags) ? 0 : nl_add_hl(tcp->seq, payload_size),
             src_ip_,
             from_ip
        );
        return;
    }

    // step 2   If the state is LISTEN then

    // step 3   If the state is SYN-SENT then
    if (state_ == State::SYN_SENT) {
        if (has_ack(flags)) {
            //  If SEG.ACK =< ISS, or SEG.ACK > SND.NXT, send a reset (unless
            //  the RST bit is set, if so drop the segment and return)
        }

        if (has_rst(flags)) {
            if (has_ack(flags)) {
                // signal the user "error: connection reset"
                state_ = State::CLOSED;
            }
            return;
        }

        if (has_syn(flags)) {
            ack_number_ = tcp->seq;
            inc_ack_number(1);
            send(nullptr, 0, get_flags({ACK_MASK}));
            state_ = State::ESTABLISHED;
            poll_flags_ |= (POLLOUT | POLLWRNORM | POLLWRBAND);
            if (established_cb_) {
                established_cb_(0);
            }
        }
        return;
    }

    // otherwise
    // first check sequence number
    if (has_rst(flags)) {
        switch (state_) {
            case State::ESTABLISHED:
            case State::FIN_WAIT_1:
            case State::FIN_WAIT_2:
            case State::CLOSE_WAIT:
//                If the RST bit is set then, any outstanding RECEIVEs and SEND
//                should receive "reset" responses.  All segment queues should be
//                flushed.  Users should also receive an unsolicited general
//                "connection reset" signal.  Enter the CLOSED state, delete the
//                TCB, and return.
                state_ = State::CLOSED;
                return;
            case State::CLOSING:
            case State::LAST_ACK:
            case State::TIME_WAIT:
                state_ = State::CLOSED;
                return;
        }
    }

    if (has_syn(flags)) {
        switch (state_) {
            case State::SYN_RECEIVED:
            case State::ESTABLISHED:
            case State::FIN_WAIT_1:
            case State::FIN_WAIT_2:
            case State::CLOSE_WAIT:
            case State::CLOSING:
            case State::LAST_ACK:
            case State::TIME_WAIT:
                inc_ack_number(1);
                send(nullptr, 0, get_flags({RST_MASK, ACK_MASK}));
                state_ = State::CLOSED;
                return;
        }
    }

    if (!has_ack(flags)) {
        return;
    }

    uint32_t acked = ntohl(tcp->ack);
    while (!send_buf_.empty()) {
        std::unique_lock lck0(_read_m);
        auto &p = send_buf_.front();
        lck0.unlock();
        auto *packet = reinterpret_cast<tcp_t *>(p.first);
        uint32_t next_seq = ntohl(nl_add_hl(packet->seq, p.second));
        if (next_seq <= acked) {
            if (has_fin(packet->flags)) {
                if (state_ == State::FIN_WAIT_1) {
                    state_ = State::FIN_WAIT_2;
                } else if (state_ == State::LAST_ACK) {
                    state_ = State::CLOSED;
                    if (close_cb_) {
                        close_cb_(0);
                    }
                }
            }
            delete[] p.first;
            std::unique_lock lck1(_read_m);
            send_buf_.pop_front();
            lck1.unlock();
        } else {
            break;
        }
    }

    if (payload_size > 0) {
        std::unique_lock<std::mutex> lck(_read_m);
        uint8_t const *payload = data + header_len;
        _recv_buf.insert(_recv_buf.end(), payload, payload + payload_size);
        poll_flags_ |= (POLLIN | POLLPRI | POLLRDNORM | POLLRDBAND);
        lck.unlock();
        inc_ack_number(payload_size);
        send(nullptr, 0, get_flags({ACK_MASK}));
    }

    if (has_fin(flags)) {
        inc_ack_number(1);
        send(nullptr, 0, get_flags({ACK_MASK}));

        switch (state_) {
            case State::SYN_RECEIVED:
            case State::ESTABLISHED:
                state_ = State::CLOSE_WAIT;
                break;
            case State::FIN_WAIT_1:
            case State::FIN_WAIT_2:
                state_ = State::TIME_WAIT;
                std::thread([&] {
                    std::this_thread::sleep_for(std::chrono::milliseconds(1000 * 2));
                    state_ = State::CLOSED;
                }).detach();
                break;
            case State::CLOSE_WAIT:
            case State::CLOSING:
            case State::LAST_ACK:
                break;
            case State::TIME_WAIT:
                break;
        }
        poll_flags_ |= (POLLIN | POLLPRI | POLLRDNORM | POLLRDBAND);
    }
}